

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayalgorithms.h
# Opt level: O0

size_t qstrlen(char *str)

{
  char *in_RDI;
  undefined8 local_10;
  
  if (in_RDI == (char *)0x0) {
    local_10 = 0;
  }
  else {
    local_10 = strlen(in_RDI);
  }
  return local_10;
}

Assistant:

inline size_t qstrlen(const char *str)
{
    QT_WARNING_PUSH
#if defined(Q_CC_GNU_ONLY) && Q_CC_GNU >= 900 && Q_CC_GNU < 1000
    // spurious compiler warning (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=91490#c6)
    // when Q_DECLARE_METATYPE_TEMPLATE_1ARG is used
    QT_WARNING_DISABLE_GCC("-Wstringop-overflow")
#endif
    return str ? strlen(str) : 0;
    QT_WARNING_POP
}